

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_getpath(void)

{
  size_t sVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  uv_loop_t *loop;
  long lVar5;
  char *pcVar6;
  size_t len;
  char buf [1024];
  size_t local_440;
  char local_438 [1032];
  
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  do {
    if (lVar5 == 0x28) {
      remove("watch_dir/");
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar3 = uv_default_loop();
      iVar2 = uv_loop_close(uVar3);
      if (iVar2 == 0) {
        return 0;
      }
      pcVar6 = "0 == uv_loop_close(uv_default_loop())";
      uVar3 = 0x41a;
LAB_0011c939:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
              ,uVar3,pcVar6);
      abort();
    }
    iVar2 = uv_fs_event_init(uVar3,&fs_event);
    if (iVar2 != 0) {
      pcVar6 = "r == 0";
      uVar3 = 0x400;
      goto LAB_0011c939;
    }
    local_440 = 0x400;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    if (iVar2 != -0x16) {
      pcVar6 = "r == UV_EINVAL";
      uVar3 = 0x403;
      goto LAB_0011c939;
    }
    pcVar6 = *(char **)((long)&DAT_00196ca0 + lVar5);
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,pcVar6,0);
    if (iVar2 != 0) {
      pcVar6 = "r == 0";
      uVar3 = 0x405;
      goto LAB_0011c939;
    }
    local_440 = 0;
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != -0x69) {
      pcVar6 = "r == UV_ENOBUFS";
      uVar3 = 0x408;
      goto LAB_0011c939;
    }
    if (0x3ff < local_440) {
      pcVar6 = "len < sizeof buf";
      uVar3 = 0x409;
      goto LAB_0011c939;
    }
    sVar4 = strlen(pcVar6);
    if (sVar1 != sVar4 + 1) {
      pcVar6 = "len == strlen(watch_dir[i]) + 1";
      uVar3 = 0x40a;
      goto LAB_0011c939;
    }
    iVar2 = uv_fs_event_getpath(&fs_event,local_438,&local_440);
    sVar1 = local_440;
    if (iVar2 != 0) {
      pcVar6 = "r == 0";
      uVar3 = 0x40c;
      goto LAB_0011c939;
    }
    sVar4 = strlen(pcVar6);
    if (sVar1 != sVar4) {
      pcVar6 = "len == strlen(watch_dir[i])";
      uVar3 = 0x40d;
      goto LAB_0011c939;
    }
    iVar2 = strcmp(local_438,pcVar6);
    if (iVar2 != 0) {
      pcVar6 = "strcmp(buf, watch_dir[i]) == 0";
      uVar3 = 0x40e;
      goto LAB_0011c939;
    }
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 != 0) {
      pcVar6 = "r == 0";
      uVar3 = 0x410;
      goto LAB_0011c939;
    }
    uv_close(&fs_event,close_cb);
    uv_run(uVar3,0);
    if (close_cb_called != 1) {
      pcVar6 = "close_cb_called == 1";
      uVar3 = 0x415;
      goto LAB_0011c939;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

TEST_IMPL(fs_event_getpath) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned i;
  int r;
  char buf[1024];
  size_t len;
  const char* const watch_dir[] = {
    "watch_dir",
    "watch_dir/",
    "watch_dir///",
    "watch_dir/subfolder/..",
    "watch_dir//subfolder//..//",
  };

  create_dir("watch_dir");
  create_dir("watch_dir/subfolder");


  for (i = 0; i < ARRAY_SIZE(watch_dir); i++) {
    r = uv_fs_event_init(loop, &fs_event);
    ASSERT(r == 0);
    len = sizeof buf;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_EINVAL);
    r = uv_fs_event_start(&fs_event, fail_cb, watch_dir[i], 0);
    ASSERT(r == 0);
    len = 0;
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == UV_ENOBUFS);
    ASSERT(len < sizeof buf); /* sanity check */
    ASSERT(len == strlen(watch_dir[i]) + 1);
    r = uv_fs_event_getpath(&fs_event, buf, &len);
    ASSERT(r == 0);
    ASSERT(len == strlen(watch_dir[i]));
    ASSERT(strcmp(buf, watch_dir[i]) == 0);
    r = uv_fs_event_stop(&fs_event);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &fs_event, close_cb);

    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(close_cb_called == 1);
    close_cb_called = 0;
  }

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY();
  return 0;
}